

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  uint uVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  bool bVar10;
  float fVar11;
  double dVar12;
  
  uVar9 = *X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0.0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  if (length < 2) {
    length = 1;
    uVar8 = 0;
    dVar12 = 0.0;
  }
  else {
    uVar8 = 0;
    uVar7 = 1;
    dVar12 = 0.0;
    do {
      uVar2 = X[uVar7];
      if (uVar2 != uVar9) {
        uVar5 = (uint32_t)uVar7;
        iVar6 = uVar5 - uVar8;
        if (uVar9 != 0) {
          bit_entropy->sum = bit_entropy->sum + iVar6 * uVar9;
          bit_entropy->nonzeros = (bit_entropy->nonzeros + uVar5) - uVar8;
          bit_entropy->nonzero_code = uVar8;
          if (uVar9 < 0x100) {
            fVar11 = kSLog2Table[uVar9];
          }
          else {
            fVar11 = (*VP8LFastSLog2Slow)(uVar9);
            dVar12 = bit_entropy->entropy;
          }
          dVar12 = dVar12 - (double)((float)iVar6 * fVar11);
          bit_entropy->entropy = dVar12;
          if (bit_entropy->max_val < uVar9) {
            bit_entropy->max_val = uVar9;
          }
        }
        bVar4 = 3 < iVar6;
        bVar10 = uVar9 != 0;
        stats->counts[bVar10] = stats->counts[bVar10] + (uint)bVar4;
        stats->streaks[bVar10][bVar4] = (stats->streaks[bVar10][bVar4] - uVar8) + uVar5;
        uVar9 = uVar2;
        uVar8 = uVar5;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)length != uVar7);
  }
  iVar6 = length - uVar8;
  if (uVar9 != 0) {
    bit_entropy->sum = bit_entropy->sum + iVar6 * uVar9;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar6;
    bit_entropy->nonzero_code = uVar8;
    if (uVar9 < 0x100) {
      fVar11 = kSLog2Table[uVar9];
    }
    else {
      fVar11 = (*VP8LFastSLog2Slow)(uVar9);
      dVar12 = bit_entropy->entropy;
    }
    dVar12 = dVar12 - (double)((float)iVar6 * fVar11);
    bit_entropy->entropy = dVar12;
    if (bit_entropy->max_val < uVar9) {
      bit_entropy->max_val = uVar9;
    }
  }
  stats->counts[uVar9 != 0] = stats->counts[uVar9 != 0] + (uint)(3 < iVar6);
  piVar1 = stats->streaks[uVar9 != 0] + (3 < iVar6);
  *piVar1 = *piVar1 + iVar6;
  uVar3 = bit_entropy->sum;
  if ((ulong)uVar3 < 0x100) {
    fVar11 = kSLog2Table[uVar3];
  }
  else {
    fVar11 = (*VP8LFastSLog2Slow)(uVar3);
    dVar12 = bit_entropy->entropy;
  }
  bit_entropy->entropy = (double)fVar11 + dVar12;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(const uint32_t X[], int length,
                                  VP8LBitEntropy* const bit_entropy,
                                  VP8LStreaks* const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}